

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetDampingAA(void *kinmem,sunrealtype beta)

{
  KINMem in_RDI;
  double in_XMM0_Qa;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0xd5,"KINSetDampingAA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else if (0.0 < in_XMM0_Qa) {
    if (1.0 <= in_XMM0_Qa) {
      in_RDI->kin_beta_aa = 1.0;
      in_RDI->kin_damping_aa = 0;
    }
    else {
      in_RDI->kin_beta_aa = in_XMM0_Qa;
      in_RDI->kin_damping_aa = 1;
    }
    local_4 = 0;
  }
  else {
    KINProcessError(in_RDI,-2,0xde,"KINSetDampingAA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"beta <= 0 illegal");
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int KINSetDampingAA(void* kinmem, sunrealtype beta)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  /* check for illegal input value */
  if (beta <= ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "beta <= 0 illegal");
    return (KIN_ILL_INPUT);
  }

  if (beta < ONE)
  {
    /* enable damping */
    kin_mem->kin_beta_aa    = beta;
    kin_mem->kin_damping_aa = SUNTRUE;
  }
  else
  {
    /* disable damping */
    kin_mem->kin_beta_aa    = ONE;
    kin_mem->kin_damping_aa = SUNFALSE;
  }

  return (KIN_SUCCESS);
}